

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall TPZFrontSym<float>::PrintGlobal(TPZFrontSym<float> *this,char *name,ostream *out)

{
  long *plVar1;
  char cVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (name == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar3);
  }
  cVar2 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  lVar6 = (this->super_TPZFront<float>).fLocal.fNElements;
  if (0 < lVar6) {
    lVar9 = 0;
    do {
      if ((this->super_TPZFront<float>).fLocal.fStore[lVar9] != -1) {
        poVar4 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar6 = (this->super_TPZFront<float>).fLocal.fNElements;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < lVar6);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  lVar6 = (this->super_TPZFront<float>).fLocal.fNElements;
  if (0 < lVar6) {
    lVar9 = 0;
    do {
      if ((this->super_TPZFront<float>).fLocal.fStore[lVar9] != -1) {
        if (0 < lVar6) {
          lVar8 = 0;
          do {
            plVar1 = (this->super_TPZFront<float>).fLocal.fStore;
            lVar7 = plVar1[lVar8];
            if (lVar7 != -1) {
              lVar6 = plVar1[lVar9];
              lVar5 = lVar7;
              if (lVar7 < lVar6) {
                lVar5 = lVar6;
              }
              if (lVar6 < lVar7) {
                lVar7 = lVar6;
              }
              lVar5 = (lVar5 + 1) * lVar5;
              poVar4 = std::ostream::_M_insert<double>
                                 ((double)*(float *)((long)(this->super_TPZFront<float>).fData.
                                                           fStore +
                                                    lVar7 * 4 +
                                                    (lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffeU)
                                                    * 2));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              lVar6 = (this->super_TPZFront<float>).fLocal.fNElements;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < lVar6);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        lVar6 = (this->super_TPZFront<float>).fLocal.fNElements;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < lVar6);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void TPZFrontSym<TVar>::PrintGlobal(const char *name, std::ostream& out){
	int64_t i, j;
	out << name << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]!=-1) out << i << " ";
	}
	out << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]==-1) continue;
		for(j=0;j<this->fLocal.NElements();j++){
			if(this->fLocal[j]==-1) continue;
			out << Element(this->fLocal[i],this->fLocal[j]) << " ";
		}
		out << endl;
	}
	out << endl;
}